

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,_kj::WaiterQueue<unsigned_long>::Node>::destroy
          (AdapterPromiseNode<unsigned_long,_kj::WaiterQueue<unsigned_long>::Node> *this)

{
  AdapterPromiseNode<unsigned_long,_kj::WaiterQueue<unsigned_long>::Node> *this_local;
  
  freePromise<kj::_::AdapterPromiseNode<unsigned_long,kj::WaiterQueue<unsigned_long>::Node>>(this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }